

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfswindow.cpp
# Opt level: O2

void __thiscall QEglFSWindow::invalidateSurface(QEglFSWindow *this)

{
  int iVar1;
  uint uVar2;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  long lVar5;
  EGLSurface pvVar6;
  undefined8 uVar7;
  QEglFSScreen *this_00;
  QEglFSDeviceIntegration *pQVar8;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_surface == (EGLSurface)0x0) goto LAB_0011cad6;
  pQVar3 = QtPrivateLogging::qLcEglDevDebug();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = pQVar3->name;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_28,"virtual void QEglFSWindow::invalidateSurface()");
    pQVar4 = QDebug::operator<<(pQVar4," about to destroy EGLSurface: ");
    QDebug::operator<<(pQVar4,this->m_surface);
    QDebug::~QDebug(&local_28);
  }
  lVar5 = (**(code **)(*(long *)this + 0x18))(this);
  iVar1 = eglDestroySurface(*(undefined8 *)(lVar5 + 0x10));
  if (iVar1 == 0) {
    pQVar3 = QtPrivateLogging::qLcEglDevDebug();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar3->name;
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      uVar2 = eglGetError();
      QMessageLogger::warning
                (local_48,
                 "QEglFSWindow::invalidateSurface() eglDestroySurface failed! Follow-up errors or memory leaks are possible. eglGetError(): %x"
                 ,(ulong)uVar2);
    }
  }
  pvVar6 = (EGLSurface)eglGetCurrentSurface(0x305a);
  if (pvVar6 == this->m_surface) {
LAB_0011ca13:
    uVar7 = eglGetCurrentDisplay();
    iVar1 = eglMakeCurrent(uVar7,0,0,0);
    pQVar3 = QtPrivateLogging::qLcEglDevDebug();
    if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar3->name;
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_28,"virtual void QEglFSWindow::invalidateSurface()");
      pQVar4 = QDebug::operator<<(pQVar4," due to eglDestroySurface on *currently* bound surface");
      pQVar4 = QDebug::operator<<(pQVar4,"we just called eglMakeCurrent(..,0,0,0)! It returned: ");
      QDebug::operator<<(pQVar4,iVar1 != 0);
      QDebug::~QDebug(&local_28);
    }
  }
  else {
    pvVar6 = (EGLSurface)eglGetCurrentSurface(0x3059);
    if (pvVar6 == this->m_surface) goto LAB_0011ca13;
  }
  lVar5 = (**(code **)(*(long *)this + 0x18))(this);
  if (*(EGLSurface *)(lVar5 + 0x18) == this->m_surface) {
    this_00 = (QEglFSScreen *)(**(code **)(*(long *)this + 0x18))(this);
    QEglFSScreen::setPrimarySurface(this_00,(EGLSurface)0x0);
  }
  this->m_surface = (EGLSurface)0x0;
  *(byte *)&(this->m_flags).super_QFlagsStorageHelper<QEglFSWindow::Flag,_4>.
            super_QFlagsStorage<QEglFSWindow::Flag>.i =
       (byte)(this->m_flags).super_QFlagsStorageHelper<QEglFSWindow::Flag,_4>.
             super_QFlagsStorage<QEglFSWindow::Flag>.i & 0xfe;
LAB_0011cad6:
  pQVar8 = qt_egl_device_integration();
  (*pQVar8->_vptr_QEglFSDeviceIntegration[0x17])(pQVar8,this->m_window);
  this->m_window = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSWindow::invalidateSurface()
{
    if (m_surface != EGL_NO_SURFACE) {
        qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " about to destroy EGLSurface: " << m_surface;

        bool ok = eglDestroySurface(screen()->display(), m_surface);

        if (!ok) {
            qCWarning(qLcEglDevDebug, "QEglFSWindow::invalidateSurface() eglDestroySurface failed!"
                                      " Follow-up errors or memory leaks are possible."
                                      " eglGetError(): %x", eglGetError());
        }

        if (eglGetCurrentSurface(EGL_READ) == m_surface ||
                eglGetCurrentSurface(EGL_DRAW) == m_surface) {
            bool ok = eglMakeCurrent(eglGetCurrentDisplay(), EGL_NO_DISPLAY, EGL_NO_DISPLAY, EGL_NO_CONTEXT);
            qCDebug(qLcEglDevDebug) << Q_FUNC_INFO << " due to eglDestroySurface on *currently* bound surface"
                                    << "we just called eglMakeCurrent(..,0,0,0)! It returned: " << ok;
        }

        if (screen()->primarySurface() == m_surface)
            screen()->setPrimarySurface(EGL_NO_SURFACE);

        m_surface = EGL_NO_SURFACE;
        m_flags = m_flags & ~Created;
    }
    qt_egl_device_integration()->destroyNativeWindow(m_window);
    m_window = 0;
}